

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinDeserializer<std::tuple<char,_int>[10],_void>::resize
               (undefined8 param_1,uint param_2)

{
  runtime_error *this;
  string sStack_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (param_2 == 10) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_b8,param_2);
  std::operator+(&local_98,"Serialized sequence size = ",&local_b8);
  std::operator+(&local_78,&local_98," != ");
  std::__cxx11::to_string(&sStack_d8,10);
  std::operator+(&local_58,&local_78,&sStack_d8);
  std::operator+(&local_38,&local_58," = target size, and target cannot be .resize()-ed");
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void resize(std::false_type /* no resize */, Sequence& s, std::uint32_t new_size)
  {
    const auto size = sequence_size(s);
    if (size != new_size)
    {
      throw std::runtime_error(
        "Serialized sequence size = " + std::to_string(new_size)
        + " != " + std::to_string(size) + " = target size, "
        "and target cannot be .resize()-ed"
      );
    }
  }